

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

_Bool artifact_is_known(wchar_t a_idx)

{
  _Bool _Var1;
  object *obj_00;
  object *obj;
  wchar_t a_idx_local;
  
  if (a_info[a_idx].name == (char *)0x0) {
    obj._7_1_ = false;
  }
  else if ((player->wizard & 1U) == 0) {
    _Var1 = is_artifact_created(a_info + a_idx);
    if (_Var1) {
      obj_00 = find_artifact(a_info + a_idx);
      if ((obj_00 != (object *)0x0) && (_Var1 = object_is_known_artifact(obj_00), !_Var1)) {
        return false;
      }
      obj._7_1_ = true;
    }
    else {
      obj._7_1_ = false;
    }
  }
  else {
    obj._7_1_ = true;
  }
  return obj._7_1_;
}

Assistant:

static bool artifact_is_known(int a_idx)
{
	struct object *obj;

	if (!a_info[a_idx].name)
		return false;

	if (player->wizard)
		return true;

	if (!is_artifact_created(&a_info[a_idx]))
		return false;

	/* Check all objects to see if it exists but hasn't been IDed */
	obj = find_artifact(&a_info[a_idx]);
	if (obj && !object_is_known_artifact(obj))
		return false;

	return true;
}